

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

void Dau_FunctionEnum(int nInputs,int nVars,int nNodeMax,int fUseTwo,int fReduce,int fVerbose)

{
  uint iStart;
  uint uVar1;
  ulong uVar2;
  Vec_Int_t *pVVar3;
  word **__ptr;
  int iVar4;
  int iVar5;
  Abc_TtHieMan_t *pMan;
  Vec_Mem_t *p;
  Vec_Int_t *p_00;
  int *piVar6;
  word *pwVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  word *pwVar12;
  ulong uVar13;
  ulong uVar14;
  uint nVars_00;
  word *pwVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  word *pwVar20;
  uint uVar21;
  long lVar22;
  int Count2;
  bool bVar23;
  bool bVar24;
  long local_200;
  word tCur;
  ulong local_1a0 [5];
  word *local_178;
  word *local_170;
  word *local_168;
  word *local_160;
  word *local_158;
  int local_14c;
  word *local_148;
  word local_140;
  word *local_138;
  word *local_130;
  word *local_128;
  word *local_120;
  word *local_118;
  int local_110;
  int local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  word *local_f0;
  long local_e8;
  word tCur_1;
  int Limit [32];
  word Truth [4];
  
  local_110 = fUseTwo;
  local_10c = fReduce;
  iVar4 = clock_gettime(3,(timespec *)Limit);
  if (iVar4 < 0) {
    local_200 = -1;
  }
  else {
    local_200 = (long)Limit._8_8_ / 1000 + Limit._0_8_ * 1000000;
  }
  iVar4 = 1 << ((char)nInputs - 6U & 0x1f);
  if (nInputs < 7) {
    iVar4 = 1;
  }
  pMan = Abc_TtHieManStart(nInputs,5);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar4;
  p->LogPageSze = 0x10;
  p->PageMask = 0xffff;
  p->iPage = -1;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  p_00->pArray = piVar6;
  Limit[2] = 0;
  Limit[3] = 0;
  Limit[0x1c] = 0;
  Limit[0x1d] = 0;
  Limit[0x1e] = 0;
  Limit[0x1f] = 0;
  Limit[0x18] = 0;
  Limit[0x19] = 0;
  Limit[0x1a] = 0;
  Limit[0x1b] = 0;
  Limit[0x14] = 0;
  Limit[0x15] = 0;
  Limit[0x16] = 0;
  Limit[0x17] = 0;
  Limit[0x10] = 0;
  Limit[0x11] = 0;
  Limit[0x12] = 0;
  Limit[0x13] = 0;
  Limit[0xc] = 0;
  Limit[0xd] = 0;
  Limit[0xe] = 0;
  Limit[0xf] = 0;
  Limit[8] = 0;
  Limit[9] = 0;
  Limit[10] = 0;
  Limit[0xb] = 0;
  Limit[4] = 0;
  Limit[5] = 0;
  Limit[6] = 0;
  Limit[7] = 0;
  Limit[0] = 1;
  Limit[1] = 2;
  Truth[2] = 0;
  Truth[3] = 0;
  Truth[0] = 0;
  Truth[1] = 0;
  if (((6 < nInputs) || (nInputs < nVars)) || (nVars < 3)) {
    __assert_fail("nVars >= 3 && nVars <= nInputs && nInputs <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                  ,0x277,"void Dau_FunctionEnum(int, int, int, int, int, int)");
  }
  Vec_MemHashAlloc(p,0x10000);
  Vec_MemHashInsert(p,Truth);
  Vec_IntPush(p_00,0);
  Truth[0] = 0x5555555555555555;
  Vec_MemHashInsert(p,Truth);
  Vec_IntPush(p_00,1);
  Dau_PrintStats(0,nInputs,nVars,p_00,0,2,0,0,local_200);
  local_108 = (ulong)(uint)nNodeMax;
  local_140 = 0;
  if (nNodeMax < 1) {
    nNodeMax = 0;
  }
  local_100 = (ulong)(nNodeMax + 1);
  uVar13 = 1;
  uVar21 = 1;
  do {
    if (uVar13 == local_100) {
      iVar4 = p_00->nSize;
      break;
    }
    bVar23 = local_10c == 0;
    bVar24 = uVar13 != local_108;
    iStart = Limit[uVar13];
    iVar5 = (int)uVar13;
    if ((int)uVar21 < (int)iStart) {
      local_f8 = uVar13 - 1;
      uVar17 = (ulong)uVar21;
      do {
        if (((int)uVar21 < 0) || (uVar19 = (uint)uVar17, p->nEntries <= (int)uVar19))
        goto LAB_00523558;
        if (p_00->nSize <= (int)uVar19) goto LAB_00523577;
        pwVar7 = p->ppPages[uVar19 >> ((byte)p->LogPageSze & 0x1f)];
        lVar22 = (long)(int)(p->PageMask & uVar19) * (long)p->nEntrySize;
        uVar1 = p_00->pArray[uVar17];
        nVars_00 = uVar1 & 0xf;
        pwVar15 = (word *)(ulong)nVars_00;
        iVar4 = Dau_CountSymms2(pwVar7[lVar22],nVars_00);
        local_148 = (word *)CONCAT44(local_148._4_4_,iVar4);
        if (local_f8 != (uint)((int)uVar1 >> 0x10)) {
          __assert_fail("n-1 == (NodSup >> 16)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x28d,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        local_178 = pwVar15;
        local_138 = pwVar7;
        local_e8 = lVar22;
        if ((s_Truths6Neg[(long)pwVar15] &
            (pwVar7[lVar22] >> ((byte)(1L << (sbyte)nVars_00) & 0x3f) ^ pwVar7[lVar22])) != 0) {
          __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x28e,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        if (nVars_00 != 0) {
          local_14c = nVars_00 + 1;
          local_f0 = (word *)((long)pwVar15 + -1);
          local_168 = (word *)0xffffffffffffffff;
          pwVar7 = (word *)0x0;
          do {
            local_170 = pwVar7;
            if (((uint)local_148 >> ((uint)pwVar7 & 0x1f) & 1) == 0) {
              if (&DAT_00000005 < pwVar7) {
LAB_00523539:
                __assert_fail("iVar >= 0 && iVar < 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x337,"word Abc_Tt6Cofactor0(word, int)");
              }
              uVar16 = s_Truths6Neg[(long)pwVar7] & local_138[local_e8];
              bVar9 = (byte)(1 << ((byte)pwVar7 & 0x1f));
              uVar2 = s_Truths6[(long)pwVar7];
              uVar11 = local_138[local_e8] & uVar2;
              uVar16 = uVar16 << (bVar9 & 0x3f) | uVar16;
              uVar11 = uVar11 >> (bVar9 & 0x3f) | uVar11;
              if ((int)nVars_00 < nInputs && (bVar24 || bVar23)) {
                uVar10 = s_Truths6[(long)local_178];
                uVar14 = uVar10 & uVar2;
                tCur = uVar16 & ~uVar14 | uVar14 & uVar11;
                Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,local_14c,p,p_00,uVar19,local_200)
                ;
                iVar4 = local_14c;
                tCur = ~uVar14 & uVar11 | uVar14 & uVar16;
                Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,local_14c,p,p_00,uVar19,local_200)
                ;
                tCur = (uVar11 ^ uVar16) & (uVar10 ^ uVar2) ^ uVar16;
                Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,iVar4,p,p_00,uVar19,local_200);
                local_140 = local_140 + 3;
              }
              if (bVar24 || bVar23) {
                pwVar7 = (word *)((long)local_170 + 1);
                pwVar20 = s_Truths6;
                pwVar15 = (word *)0x0;
                local_158 = pwVar7;
                do {
                  if ((local_170 != pwVar15) &&
                     (pwVar7 == pwVar15 || ((uint)local_148 >> ((uint)pwVar15 & 0x1f) & 1) == 0)) {
                    uVar10 = *pwVar20;
                    uVar14 = uVar10 & uVar2;
                    tCur = uVar16 & ~uVar14 | uVar14 & uVar11;
                    Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                       local_200);
                    tCur = ~uVar14 & uVar11 | uVar14 & uVar16;
                    Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                       local_200);
                    uVar14 = ~uVar10 & uVar2;
                    tCur = uVar16 & ~uVar14 | uVar14 & uVar11;
                    Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                       local_200);
                    tCur = ~uVar14 & uVar11 | uVar14 & uVar16;
                    Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                       local_200);
                    tCur = (uVar11 ^ uVar16) & (uVar10 ^ uVar2) ^ uVar16;
                    Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                       local_200);
                    local_140 = local_140 + 5;
                    pwVar7 = local_158;
                  }
                  pwVar15 = (word *)((long)pwVar15 + 1);
                  pwVar20 = pwVar20 + 1;
                } while (local_178 != pwVar15);
              }
              local_160 = s_Truths6 + 1;
              local_130 = (word *)0x0;
              pwVar7 = local_168;
              pwVar15 = local_f0;
              do {
                pwVar20 = (word *)((long)local_130 + 1);
                local_118 = local_130;
                if ((local_130 != local_170) && (pwVar20 < local_178)) {
                  pwVar12 = (word *)0x0;
                  local_128 = pwVar7;
                  local_120 = pwVar15;
                  do {
                    local_130 = pwVar20;
                    if (pwVar7 != pwVar12) {
                      uVar2 = local_160[(long)pwVar12];
                      uVar10 = s_Truths6[(long)local_118];
                      uVar14 = uVar10 & uVar2;
                      tCur = uVar16 & ~uVar14 | uVar14 & uVar11;
                      local_158 = pwVar12;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      tCur = ~uVar14 & uVar11 | uVar14 & uVar16;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      uVar14 = ~uVar10 & uVar2;
                      tCur = uVar16 & ~uVar14 | uVar14 & uVar11;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      tCur = ~uVar14 & uVar11 | uVar14 & uVar16;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      uVar14 = ~uVar2 & uVar10;
                      tCur = uVar16 & ~uVar14 | uVar14 & uVar11;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      tCur = ~uVar14 & uVar11 | uVar14 & uVar16;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      uVar14 = uVar10 | uVar2;
                      tCur = uVar14 & uVar16 | uVar11 & ~uVar14;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      tCur = uVar14 & uVar11 | ~uVar14 & uVar16;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      uVar10 = uVar10 ^ uVar2;
                      tCur = uVar16 & ~uVar10 | uVar10 & uVar11;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      tCur = ~uVar10 & uVar11 | uVar10 & uVar16;
                      Dau_InsertFunction(pMan,&tCur,iVar5,nInputs,nVars,nVars_00,p,p_00,uVar19,
                                         local_200);
                      local_140 = local_140 + 10;
                      pwVar7 = local_128;
                      pwVar15 = local_120;
                      pwVar12 = local_158;
                    }
                    pwVar12 = (word *)((long)pwVar12 + 1);
                    pwVar20 = local_130;
                  } while (pwVar15 != pwVar12);
                }
                local_130 = pwVar20;
                pwVar7 = (word *)((long)pwVar7 + -1);
                local_160 = local_160 + 1;
                pwVar15 = (word *)((long)pwVar15 + -1);
              } while (local_130 != local_178);
            }
            pwVar7 = (word *)((long)local_170 + 1);
            local_168 = (word *)((long)local_168 + 1);
          } while (pwVar7 != local_178);
        }
        uVar17 = uVar17 + 1;
      } while ((int)uVar17 < (int)iStart);
    }
    Count2 = 0;
    if (((2 < uVar13 && local_110 != 0) && (bVar24 || bVar23)) &&
       (pwVar7 = (word *)(ulong)(uint)Limit[uVar13 - 2], local_168 = pwVar7,
       Limit[uVar13 - 2] < (int)uVar21)) {
      local_138 = (word *)(uVar13 - 2);
      Count2 = 0;
      do {
        if (((int)local_168 < 0) || (uVar19 = (uint)pwVar7, p->nEntries <= (int)uVar19)) {
LAB_00523558:
          __assert_fail("i >= 0 && i < p->nEntries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                        ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
        }
        if (p_00->nSize <= (int)uVar19) {
LAB_00523577:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p_00->pArray[(long)pwVar7] >> 0x10 != (int)local_138) {
          __assert_fail("n-2 == (NodSup >> 16)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x2f4,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        local_130 = p->ppPages[uVar19 >> ((byte)p->LogPageSze & 0x1f)];
        local_170 = (word *)((long)(int)(p->PageMask & uVar19) * (long)p->nEntrySize);
        uVar19 = p_00->pArray[(long)pwVar7] & 0xf;
        pwVar15 = (word *)(ulong)uVar19;
        local_160 = pwVar7;
        if ((s_Truths6Neg[(long)pwVar15] &
            (local_130[(long)local_170] >> ((byte)(1L << (sbyte)uVar19) & 0x3f) ^
            local_130[(long)local_170])) != 0) {
          __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x2f5,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        if (uVar19 != 0) {
          pwVar7 = (word *)0x0;
          local_148 = pwVar15;
          local_118 = (word *)(ulong)uVar19;
          do {
            local_178 = (word *)(ulong)(uint)(1 << ((byte)pwVar7 & 0x1f));
            pwVar20 = (word *)0x0;
            local_128 = pwVar7;
            do {
              if (pwVar20 != pwVar7) {
                if ((&DAT_00000005 < pwVar7) || (&DAT_00000005 < pwVar20)) goto LAB_00523539;
                uVar17 = s_Truths6[(long)pwVar7];
                uVar16 = local_130[(long)local_170] & uVar17;
                uVar11 = local_130[(long)local_170] & s_Truths6Neg[(long)pwVar7];
                uVar11 = uVar11 << ((byte)local_178 & 0x3f) | uVar11;
                uVar14 = uVar11 & s_Truths6Neg[(long)pwVar20];
                bVar9 = (byte)(1 << ((byte)pwVar20 & 0x1f));
                uVar2 = s_Truths6[(long)pwVar20];
                uVar11 = uVar11 & uVar2;
                uVar16 = uVar16 >> ((byte)local_178 & 0x3f) | uVar16;
                uVar10 = s_Truths6Neg[(long)pwVar20] & uVar16;
                uVar16 = uVar16 & uVar2;
                local_158 = (word *)(uVar16 >> (bVar9 & 0x3f) | uVar16);
                tCur = uVar2 & uVar17;
                local_1a0[0] = ~uVar2 & uVar17;
                local_1a0[1] = ~uVar17 & uVar2;
                local_1a0[2] = uVar2 | uVar17;
                local_1a0[3] = uVar2 ^ uVar17;
                uVar17 = 0;
                local_120 = pwVar20;
                do {
                  pwVar15 = local_118;
                  pwVar7 = local_160;
                  if (uVar17 < 4) {
                    uVar2 = local_1a0[uVar17 - 1];
                    uVar18 = (uVar14 << (bVar9 & 0x3f) | uVar14) & ~uVar2 |
                             uVar2 & (uVar11 >> (bVar9 & 0x3f) | uVar11);
                    uVar8 = uVar2 & (ulong)local_158;
                    uVar16 = uVar17;
                    do {
                      tCur_1 = local_1a0[uVar16] &
                               ((~uVar2 & (uVar10 << (bVar9 & 0x3f) | uVar10) | uVar8) ^ uVar18) ^
                               uVar18;
                      iVar4 = Dau_InsertFunction(pMan,&tCur_1,iVar5,nInputs,nVars,(int)pwVar15,p,
                                                 p_00,(int)pwVar7,local_200);
                      Count2 = Count2 + iVar4;
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != 4);
                  }
                  uVar17 = uVar17 + 1;
                  pwVar20 = local_120;
                  pwVar7 = local_128;
                  pwVar15 = local_148;
                } while (uVar17 != 5);
              }
              pwVar20 = (word *)((long)pwVar20 + 1);
            } while (pwVar20 != pwVar15);
            pwVar7 = (word *)((long)pwVar7 + 1);
          } while (pwVar7 != pwVar15);
        }
        pwVar7 = (word *)((long)local_160 + 1);
      } while ((int)pwVar7 < (int)uVar21);
    }
    iVar4 = p_00->nSize;
    Limit[uVar13 + 1] = iVar4;
    iVar5 = Dau_PrintStats(iVar5,nInputs,nVars,p_00,iStart,iVar4,local_140,Count2,local_200);
    uVar13 = uVar13 + 1;
    uVar21 = iStart;
  } while (iVar5 != 0);
  Dau_TablesSave(nInputs,nVars,p,p_00,iVar4,local_200);
  iVar5 = 3;
  iVar4 = clock_gettime(3,(timespec *)&tCur);
  if (iVar4 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = (long)local_1a0[0] / 1000 + tCur * 1000000;
  }
  Abc_Print(iVar5,"%s =","Total time");
  Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar22 - local_200) / 1000000.0,0));
  Abc_TtHieManStop(pMan);
  if (p == (Vec_Mem_t *)0x0) goto LAB_005234f8;
  pVVar3 = p->vTable;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  pVVar3 = p->vNexts;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  uVar21 = p->iPage;
  __ptr = p->ppPages;
  if ((int)uVar21 < 0) {
    if (__ptr != (word **)0x0) goto LAB_005234e6;
  }
  else {
    lVar22 = 0;
    do {
      if (__ptr[lVar22] != (word *)0x0) {
        free(__ptr[lVar22]);
        __ptr[lVar22] = (word *)0x0;
      }
      lVar22 = lVar22 + 1;
    } while ((ulong)uVar21 + 1 != lVar22);
LAB_005234e6:
    free(__ptr);
  }
  free(p);
LAB_005234f8:
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  fflush(_stdout);
}

Assistant:

void Dau_FunctionEnum( int nInputs, int nVars, int nNodeMax, int fUseTwo, int fReduce, int fVerbose )
{
    abctime clk = Abc_Clock();
    int nWords = Abc_TtWordNum(nInputs); word nSteps = 0;
    Abc_TtHieMan_t * pMan = Abc_TtHieManStart( nInputs, 5 );
    Vec_Mem_t * vTtMem  = Vec_MemAlloc( nWords, 16 );
    Vec_Int_t * vNodSup = Vec_IntAlloc( 1 << 16 );
    int v, u, k, m, n, Entry, nNew, Limit[32] = {1, 2};
    word Truth[4] = {0};
    assert( nVars >= 3 && nVars <= nInputs && nInputs <= 6 );
    Vec_MemHashAlloc( vTtMem,  1<<16 );
    // add constant 0
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 0 ); // nodes=0, supp=0
    // add buffer/inverter
    Abc_TtIthVar( Truth, 0, nInputs );
    Abc_TtNot( Truth, nWords );
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 1 ); // nodes=0, supp=1
    Dau_PrintStats( 0, nInputs, nVars, vNodSup, 0, 2, nSteps, 0, clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n <= nNodeMax; n++ )
    {
        int Count2 = 0;
        int fExpand = !(fReduce && n == nNodeMax);
        for ( Entry = Limit[n-1]; Entry < Limit[n]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup;
            int SymVars = Dau_CountSymms2( pTruth[0], nSupp );
            assert( n-1 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ ) if ( (SymVars & (1 << v)) == 0 )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );
                // add one extra variable to support
                if ( nSupp < nInputs && fExpand )
                {
                    tGate = s_Truths6[v] & s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    nSteps += 3;
                }
                // add one cross bar
                if ( fExpand )
                for ( k = 0; k < nSupp; k++ ) if ( k != v && ((SymVars & (1 << k)) == 0 || k == v+1) )
                {
                    tGate = s_Truths6[v] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[v] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 5;
                }
                // add two cross bars
                for ( k = 0;   k < nSupp; k++ ) if ( k != v )//&& ((SymVars & (1 << k)) == 0) )
                for ( m = k+1; m < nSupp; m++ ) if ( m != v )//&& ((SymVars & (1 << m)) == 0 || m == k+1) )
                {
                    tGate = s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    
                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 10;
                }
            }
        } 
        if ( fUseTwo && n > 2 && fExpand )
        for ( Entry = Limit[n-2]; Entry < Limit[n-1]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup; int g1, g2;
            assert( n-2 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            for ( v = 0; v < nSupp; v++ )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, u );

                word tGates[5], tCur;
                tGates[0] =  s_Truths6[v] &  s_Truths6[u];
                tGates[1] =  s_Truths6[v] & ~s_Truths6[u];
                tGates[2] = ~s_Truths6[v] &  s_Truths6[u];
                tGates[3] =  s_Truths6[v] |  s_Truths6[u];
                tGates[4] =  s_Truths6[v] ^  s_Truths6[u];

                for ( g1 = 0;    g1 < 5; g1++ )
                for ( g2 = g1+1; g2 < 5; g2++ )
                {
                    Cof0  = (tGates[g1] & Cof01) | (~tGates[g1] & Cof00);
                    Cof1  = (tGates[g1] & Cof11) | (~tGates[g1] & Cof10);

                    tCur  = (tGates[g2] & Cof1)  | (~tGates[g2] & Cof0);
                    Count2 += Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );
                }
            }
        }
        Limit[n+1] = Vec_IntSize(vNodSup);
        nNew = Dau_PrintStats( n, nInputs, nVars, vNodSup, Limit[n], Limit[n+1], nSteps, Count2, clk );
        if ( nNew == 0 )
            break;
    }
    Dau_TablesSave( nInputs, nVars, vTtMem, vNodSup, Vec_IntSize(vNodSup), clk );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    //Dau_DumpFuncs( vTtMem, vNodSup, nVars, nNodeMax );
    //Dau_ExactNpnPrint( vTtMem, vNodSup, nVars, nInputs, n );
    Abc_TtHieManStop( pMan );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    Vec_IntFree( vNodSup );
    fflush(stdout);
}